

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O3

Pair<Corrade::Utility::TweakableState,_bool> __thiscall
Corrade::Utility::TweakableParser<bool>::parse(TweakableParser<bool> *this,StringView value)

{
  bool bVar1;
  Debug *pDVar2;
  ushort uVar3;
  ushort uVar4;
  StringView value_00;
  StringView b;
  StringView b_00;
  StringView a;
  StringView a_00;
  Warning WStack_48;
  
  a._sizePlusFlags = value._data;
  b._sizePlusFlags = 0xc000000000000004;
  b._data = "true";
  a._data = (char *)this;
  bVar1 = Containers::operator==(a,b);
  uVar3 = 0x100;
  uVar4 = 1;
  if (!bVar1) {
    b_00._sizePlusFlags = 0xc000000000000005;
    b_00._data = "false";
    a_00._sizePlusFlags = (size_t)a._sizePlusFlags;
    a_00._data = (char *)this;
    bVar1 = Containers::operator==(a_00,b_00);
    if (!bVar1) {
      Warning::Warning(&WStack_48,(Flags)0x0);
      pDVar2 = Debug::operator<<(&WStack_48.super_Debug,"Utility::TweakableParser:");
      value_00._sizePlusFlags = (size_t)a._sizePlusFlags;
      value_00._data = (char *)this;
      pDVar2 = Debug::operator<<(pDVar2,value_00);
      Debug::operator<<(pDVar2,"is not a boolean literal");
      Warning::~Warning(&WStack_48);
      uVar4 = 2;
    }
    uVar3 = 0;
  }
  return (Pair<Corrade::Utility::TweakableState,_bool>)(uVar3 | uVar4);
}

Assistant:

Containers::Pair<TweakableState, bool> TweakableParser<bool>::parse(Containers::StringView value) {
    using namespace Containers::Literals;

    if(value == "true"_s)
        return {TweakableState::Success, true};
    if(value == "false"_s)
        return {TweakableState::Success, false};

    Warning{} << "Utility::TweakableParser:" << value << "is not a boolean literal";
    return {TweakableState::Recompile, {}};
}